

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_fe.h
# Opt level: O3

Matrix<double,_1,__1,_1,_1,__1> __thiscall
lf::fe::FeHierarchicTria<double>::NodalValuesToEdgeDofs
          (FeHierarchicTria<double> *this,Matrix<double,_1,__1,_1,_1,__1> *nodevals)

{
  uint uVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  Matrix<double,_1,__1,_1,_1,__1> *pMVar5;
  double *pdVar6;
  DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0> *pDVar7;
  LhsNested LVar8;
  CoeffReturnType pdVar9;
  double *pdVar10;
  DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0> *in_RDX;
  Index extraout_RDX;
  Index extraout_RDX_00;
  Index extraout_RDX_01;
  Index extraout_RDX_02;
  Index IVar11;
  uint uVar12;
  Index col;
  long lVar13;
  Matrix<double,_1,__1,_1,_1,__1> MVar14;
  Matrix<double,_1,__1,_1,_1,__1> psidd;
  Matrix<double,_1,__1,_1,_1,__1> *dofs;
  scalar_product_op<double,_double> local_1b5;
  uint local_1b4;
  Matrix<double,_1,__1,_1,_1,__1> *local_1b0;
  Matrix<double,_1,__1,_1,_1,__1> local_1a8;
  FeHierarchicTria<double> *local_190;
  double local_188;
  double local_180;
  Scalar local_178;
  ulong local_170;
  double local_168;
  double local_160;
  Rhs local_158;
  Lhs local_150;
  ulong local_148;
  DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0> *local_140;
  ulong local_138;
  ulong local_130;
  Rhs local_128;
  Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false> local_e8;
  ulong local_b0;
  double *local_a8;
  LhsNested local_a0;
  variable_if_dynamic<long,__1> local_78;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
  local_48;
  
  uVar12 = *(uint *)((long)&(nodevals->
                            super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                            m_storage.m_cols + 4);
  local_138 = 0;
  local_148 = 0;
  if (1 < uVar12) {
    local_148 = (ulong)*(uint *)(nodevals[1].
                                 super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                                 m_storage.m_cols + 0x18);
  }
  uVar1 = *(uint *)&nodevals[1].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                    m_storage.m_data;
  if (1 < uVar1) {
    local_138 = (ulong)*(uint *)(nodevals[2].
                                 super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                                 m_storage.m_data + 3);
  }
  uVar2 = *(uint *)((long)&nodevals[1].
                           super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
                           m_data + 4);
  if (uVar2 < 2) {
    local_130 = 0;
  }
  else {
    local_130 = (ulong)*(uint *)(nodevals[2].
                                 super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                                 m_storage.m_cols + 0x18);
  }
  (this->super_ScalarReferenceFiniteElement<double>)._vptr_ScalarReferenceFiniteElement =
       (_func_int **)0x0;
  this->interior_degree_ = 0;
  (this->edge_degrees_)._M_elems[0] = 0;
  local_1b0 = nodevals;
  local_190 = this;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)this,
             (ulong)((uVar2 + uVar12 + uVar1) - 3));
  local_1b4 = 2;
  IVar11 = extraout_RDX;
  local_140 = in_RDX;
  if (*(int *)((long)&(local_1b0->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                      m_storage.m_cols + 4) - 2U < 0xfffffffd) {
    local_170 = local_148 & 0xffffffff;
    do {
      local_160 = ILegendreDx(local_1b4,0.0,1.0);
      local_168 = ILegendreDx(local_1b4,1.0,1.0);
      local_a8 = (double *)
                 (local_1b0[1].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                  m_storage.m_cols + 8);
      local_a0.m_expression.m_matrix = (NestedExpressionType)&local_1b4;
      local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data =
           (double *)0x0;
      local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,1,-1,1,1,-1>>::
      resizeLike<Eigen::CwiseUnaryOp<lf::fe::FeHierarchicTria<double>::NodalValuesToEdgeDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_1_,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
                ((PlainObjectBase<Eigen::Matrix<double,1,_1,1,1,_1>> *)&local_1a8,
                 (EigenBase<Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:962:15),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_a8);
      LVar8.m_expression.m_matrix = local_a0.m_expression.m_matrix;
      pdVar10 = (double *)*local_a8;
      dVar3 = local_a8[1];
      Eigen::internal::
      resize_if_allowed<Eigen::Matrix<double,1,_1,1,1,_1>,Eigen::CwiseUnaryOp<lf::fe::FeHierarchicTria<double>::NodalValuesToEdgeDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_1_,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,double,double>
                (&local_1a8,
                 (CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:962:15),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  *)&local_a8,(assign_op<double,_double> *)&local_128);
      pdVar6 = local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
               m_data;
      if (0 < local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
              m_cols) {
        lVar13 = 0;
        do {
          dVar4 = LegendreDx(*(uint *)LVar8.m_expression.m_matrix - 1,*pdVar10,1.0);
          pdVar6[lVar13] = dVar4;
          lVar13 = lVar13 + 1;
          pdVar10 = pdVar10 + (long)dVar3;
        } while (lVar13 < local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                          m_storage.m_cols);
      }
      local_150.m_expression.m_matrix =
           (NestedExpressionType)
           (local_1b0[1].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
            m_cols + 0x20);
      local_158.m_expression = &local_1a8;
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>
      ::CwiseBinaryOp(&local_48,&local_150,&local_158,
                      (scalar_product_op<double,_double> *)&local_128);
      pDVar7 = local_140;
      Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>::Block
                (&local_e8,(Matrix<double,_1,__1,_1,_1,__1> *)local_140,0,3,1,local_170);
      local_128.m_expression.
      super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      m_outerStride =
           local_e8.
           super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>
           .super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
           m_outerStride;
      local_128.m_expression.
      super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>._32_8_
           = local_e8.
             super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>
             ._32_8_;
      local_128.m_expression.
      super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      m_startCol.m_value =
           local_e8.
           super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>
           .super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
           m_startCol.m_value;
      local_128.m_expression.
      super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.
      m_cols.m_value =
           local_e8.
           super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>
           .super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
           super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>
           .m_cols.m_value;
      local_128.m_expression.
      super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.m_xpr
           = local_e8.
             super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>
             .m_xpr;
      local_128.m_expression.
      super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.
      m_data = local_e8.
               super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>
               .
               super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>
               .m_data;
      local_128.m_expression.
      super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.
      _8_8_ = local_e8.
              super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>
              .
              super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>
              ._8_8_;
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>_>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>_>
                       *)&local_a8,&local_48,&local_128,&local_1b5);
      if (local_78.m_value == 0) {
        local_178 = 0.0;
      }
      else {
        local_178 = Eigen::
                    DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,-1,1,1,-1>>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,1,-1,1,1,-1>const,1,-1,false>const>const>>
                    ::redux<Eigen::internal::scalar_sum_op<double,double>>
                              ((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,_1,1,1,_1>>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,1,_1,1,1,_1>const,1,_1,false>const>const>>
                                *)&local_a8,(scalar_sum_op<double,_double> *)&local_1b5);
      }
      if (*(int *)local_1b0[3].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                  m_storage.m_cols == 1) {
        pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                           (pDVar7,1);
        local_180 = *pdVar9;
        pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                           (pDVar7,0);
        uVar12 = local_1b4;
        local_188 = *pdVar9;
        pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)local_190
                             ,(ulong)(local_1b4 - 2));
      }
      else {
        pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                           (pDVar7,0);
        local_180 = *pdVar9;
        pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                           (pDVar7,1);
        uVar12 = local_1b4;
        local_188 = *pdVar9;
        pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)local_190
                             ,(ulong)(*(int *)((long)&(local_1b0->
                                                                                                            
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                                  ).m_storage.m_cols + 4) - local_1b4));
      }
      *pdVar10 = (double)(uVar12 * 2 - 1) *
                 ((local_168 * local_180 - local_188 * local_160) - local_178);
      free(local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data
          );
      local_1b4 = local_1b4 + 1;
      IVar11 = extraout_RDX_00;
    } while (local_1b4 <
             *(int *)((long)&(local_1b0->
                             super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                             m_storage.m_cols + 4) + 1U);
  }
  local_1b4 = 2;
  if (*(int *)&local_1b0[1].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage
               .m_data - 2U < 0xfffffffd) {
    local_170 = (ulong)((int)local_148 + 3);
    local_b0 = local_138 & 0xffffffff;
    do {
      local_160 = ILegendreDx(local_1b4,0.0,1.0);
      local_168 = ILegendreDx(local_1b4,1.0,1.0);
      local_a8 = local_1b0[2].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                 m_storage.m_data + 1;
      local_a0.m_expression.m_matrix = (NestedExpressionType)&local_1b4;
      local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data =
           (double *)0x0;
      local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,1,-1,1,1,-1>>::
      resizeLike<Eigen::CwiseUnaryOp<lf::fe::FeHierarchicTria<double>::NodalValuesToEdgeDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_2_,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
                ((PlainObjectBase<Eigen::Matrix<double,1,_1,1,1,_1>> *)&local_1a8,
                 (EigenBase<Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:982:15),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_a8);
      LVar8.m_expression.m_matrix = local_a0.m_expression.m_matrix;
      pdVar10 = (double *)*local_a8;
      dVar3 = local_a8[1];
      Eigen::internal::
      resize_if_allowed<Eigen::Matrix<double,1,_1,1,1,_1>,Eigen::CwiseUnaryOp<lf::fe::FeHierarchicTria<double>::NodalValuesToEdgeDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_2_,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,double,double>
                (&local_1a8,
                 (CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:982:15),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  *)&local_a8,(assign_op<double,_double> *)&local_128);
      pdVar6 = local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
               m_data;
      if (0 < local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
              m_cols) {
        lVar13 = 0;
        do {
          dVar4 = LegendreDx(*(uint *)LVar8.m_expression.m_matrix - 1,*pdVar10,1.0);
          pdVar6[lVar13] = dVar4;
          lVar13 = lVar13 + 1;
          pdVar10 = pdVar10 + (long)dVar3;
        } while (lVar13 < local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                          m_storage.m_cols);
      }
      local_150.m_expression.m_matrix =
           (NestedExpressionType)
           (local_1b0[2].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
            m_data + 4);
      local_158.m_expression = &local_1a8;
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>
      ::CwiseBinaryOp(&local_48,&local_150,&local_158,
                      (scalar_product_op<double,_double> *)&local_128);
      pDVar7 = local_140;
      Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>::Block
                (&local_e8,(Matrix<double,_1,__1,_1,_1,__1> *)local_140,0,local_170,1,local_b0);
      local_128.m_expression.
      super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      m_outerStride =
           local_e8.
           super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>
           .super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
           m_outerStride;
      local_128.m_expression.
      super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>._32_8_
           = local_e8.
             super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>
             ._32_8_;
      local_128.m_expression.
      super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      m_startCol.m_value =
           local_e8.
           super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>
           .super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
           m_startCol.m_value;
      local_128.m_expression.
      super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.
      m_cols.m_value =
           local_e8.
           super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>
           .super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
           super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>
           .m_cols.m_value;
      local_128.m_expression.
      super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.m_xpr
           = local_e8.
             super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>
             .m_xpr;
      local_128.m_expression.
      super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.
      m_data = local_e8.
               super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>
               .
               super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>
               .m_data;
      local_128.m_expression.
      super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.
      _8_8_ = local_e8.
              super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>
              .
              super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>
              ._8_8_;
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>_>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>_>
                       *)&local_a8,&local_48,&local_128,&local_1b5);
      if (local_78.m_value == 0) {
        local_178 = 0.0;
      }
      else {
        local_178 = Eigen::
                    DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,-1,1,1,-1>>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,1,-1,1,1,-1>const,1,-1,false>const>const>>
                    ::redux<Eigen::internal::scalar_sum_op<double,double>>
                              ((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,_1,1,1,_1>>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,1,_1,1,1,_1>const,1,_1,false>const>const>>
                                *)&local_a8,(scalar_sum_op<double,_double> *)&local_1b5);
      }
      if (*(int *)(local_1b0[3].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                   m_storage.m_cols + 4) == 1) {
        pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                           (pDVar7,2);
        local_180 = *pdVar9;
        pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                           (pDVar7,1);
        uVar12 = local_1b4;
        local_188 = *pdVar9;
        pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)local_190
                             ,(ulong)((*(int *)((long)&(local_1b0->
                                                                                                              
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                                  ).m_storage.m_cols + 4) + local_1b4) - 3));
      }
      else {
        pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                           (pDVar7,1);
        local_180 = *pdVar9;
        pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                           (pDVar7,2);
        uVar12 = local_1b4;
        local_188 = *pdVar9;
        pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)local_190
                             ,(ulong)(~local_1b4 +
                                      *(int *)((long)&(local_1b0->
                                                                                                            
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                                  ).m_storage.m_cols + 4) +
                                     *(int *)&local_1b0[1].
                                              super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                              .m_storage.m_data));
      }
      *pdVar10 = (double)(uVar12 * 2 - 1) *
                 ((local_168 * local_180 - local_188 * local_160) - local_178);
      free(local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data
          );
      local_1b4 = local_1b4 + 1;
      IVar11 = extraout_RDX_01;
    } while (local_1b4 <
             *(int *)&local_1b0[1].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                      m_storage.m_data + 1U);
  }
  local_1b4 = 2;
  if (*(int *)((long)&local_1b0[1].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                      m_storage.m_data + 4) - 2U < 0xfffffffd) {
    local_170 = (ulong)((int)local_138 + (int)local_148 + 3);
    do {
      local_160 = ILegendreDx(local_1b4,0.0,1.0);
      local_168 = ILegendreDx(local_1b4,1.0,1.0);
      pMVar5 = local_1b0;
      local_a8 = (double *)
                 (local_1b0[2].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                  m_storage.m_cols + 8);
      local_a0.m_expression.m_matrix = (NestedExpressionType)&local_1b4;
      local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data =
           (double *)0x0;
      local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,1,-1,1,1,-1>>::
      resizeLike<Eigen::CwiseUnaryOp<lf::fe::FeHierarchicTria<double>::NodalValuesToEdgeDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_3_,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
                ((PlainObjectBase<Eigen::Matrix<double,1,_1,1,1,_1>> *)&local_1a8,
                 (EigenBase<Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1003:15),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_a8);
      LVar8.m_expression.m_matrix = local_a0.m_expression.m_matrix;
      pdVar10 = (double *)*local_a8;
      dVar3 = local_a8[1];
      Eigen::internal::
      resize_if_allowed<Eigen::Matrix<double,1,_1,1,1,_1>,Eigen::CwiseUnaryOp<lf::fe::FeHierarchicTria<double>::NodalValuesToEdgeDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_3_,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,double,double>
                (&local_1a8,
                 (CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1003:15),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  *)&local_a8,(assign_op<double,_double> *)&local_128);
      pdVar6 = local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
               m_data;
      if (0 < local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
              m_cols) {
        lVar13 = 0;
        do {
          dVar4 = LegendreDx(*(uint *)LVar8.m_expression.m_matrix - 1,*pdVar10,1.0);
          pdVar6[lVar13] = dVar4;
          lVar13 = lVar13 + 1;
          pdVar10 = pdVar10 + (long)dVar3;
        } while (lVar13 < local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                          m_storage.m_cols);
      }
      local_150.m_expression.m_matrix =
           (NestedExpressionType)
           (pMVar5[2].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
            m_cols + 0x20);
      local_158.m_expression = &local_1a8;
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>
      ::CwiseBinaryOp(&local_48,&local_150,&local_158,
                      (scalar_product_op<double,_double> *)&local_128);
      pDVar7 = local_140;
      Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>::Block
                (&local_e8,(Matrix<double,_1,__1,_1,_1,__1> *)local_140,0,local_170,1,local_130);
      local_128.m_expression.
      super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      m_outerStride =
           local_e8.
           super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>
           .super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
           m_outerStride;
      local_128.m_expression.
      super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>._32_8_
           = local_e8.
             super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>
             ._32_8_;
      local_128.m_expression.
      super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      m_startCol.m_value =
           local_e8.
           super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>
           .super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
           m_startCol.m_value;
      local_128.m_expression.
      super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.
      m_cols.m_value =
           local_e8.
           super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>
           .super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
           super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>
           .m_cols.m_value;
      local_128.m_expression.
      super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.m_xpr
           = local_e8.
             super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>
             .m_xpr;
      local_128.m_expression.
      super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.
      m_data = local_e8.
               super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>
               .
               super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>
               .m_data;
      local_128.m_expression.
      super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.
      _8_8_ = local_e8.
              super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>
              .
              super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>
              ._8_8_;
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>_>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>_>
                       *)&local_a8,&local_48,&local_128,&local_1b5);
      if (local_78.m_value == 0) {
        local_178 = 0.0;
      }
      else {
        local_178 = Eigen::
                    DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,-1,1,1,-1>>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,1,-1,1,1,-1>const,1,-1,false>const>const>>
                    ::redux<Eigen::internal::scalar_sum_op<double,double>>
                              ((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,_1,1,1,_1>>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,1,_1,1,1,_1>const,1,_1,false>const>const>>
                                *)&local_a8,(scalar_sum_op<double,_double> *)&local_1b5);
      }
      if (*(int *)(local_1b0[3].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                   m_storage.m_cols + 8) == 1) {
        pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                           (pDVar7,0);
        local_180 = *pdVar9;
        pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                           (pDVar7,2);
        uVar12 = local_1b4;
        local_188 = *pdVar9;
        pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)local_190
                             ,(ulong)((*(int *)&local_1b0[1].
                                                super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                                .m_storage.m_data +
                                      *(int *)((long)&(local_1b0->
                                                                                                            
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                                  ).m_storage.m_cols + 4) + local_1b4) - 4));
      }
      else {
        pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                           (pDVar7,2);
        local_180 = *pdVar9;
        pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                           (pDVar7,0);
        uVar12 = local_1b4;
        local_188 = *pdVar9;
        pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)local_190
                             ,(ulong)((*(int *)((long)&local_1b0[1].
                                                                                                              
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                                  .m_storage.m_data + 4) +
                                      (*(int *)((long)&(local_1b0->
                                                                                                              
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                                  ).m_storage.m_cols + 4) - local_1b4) +
                                      *(int *)&local_1b0[1].
                                               super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                                               .m_storage.m_data) - 2));
      }
      *pdVar10 = (double)(uVar12 * 2 - 1) *
                 ((local_168 * local_180 - local_188 * local_160) - local_178);
      free(local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data
          );
      local_1b4 = local_1b4 + 1;
      IVar11 = extraout_RDX_02;
    } while (local_1b4 <
             *(int *)((long)&local_1b0[1].
                             super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                             m_storage.m_data + 4) + 1U);
  }
  MVar14.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols = IVar11;
  MVar14.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data =
       (double *)local_190;
  return (Matrix<double,_1,__1,_1,_1,__1>)
         MVar14.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage;
}

Assistant:

[[nodiscard]] Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> NodalValuesToEdgeDofs(
      const Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> &nodevals) const {
    const auto Ns0 = edge_degrees_[0] > 1 ? qr_dual_edge_[0]->NumPoints() : 0;
    const auto Ns1 = edge_degrees_[1] > 1 ? qr_dual_edge_[1]->NumPoints() : 0;
    const auto Ns2 = edge_degrees_[2] > 1 ? qr_dual_edge_[2]->NumPoints() : 0;
    const lf::base::size_type Nt = qr_dual_tria_->NumPoints();
    Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> dofs(
        edge_degrees_[0] + edge_degrees_[1] + edge_degrees_[2] - 3);
    // Compute the basis function coefficients on the edges
    // by applying the dual basis of the segment

    // first edge:
    for (base::size_type i = 2; i < edge_degrees_[0] + 1; ++i) {
      const SCALAR P0 = ILegendreDx(i, 0);
      const SCALAR P1 = ILegendreDx(i, 1);
      Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> psidd =
          qr_dual_edge_[0]->Points().unaryExpr(
              [&](double x) -> SCALAR { return LegendreDx(i - 1, x); });

      const SCALAR integ1 = (qr_dual_edge_[0]->Weights().transpose().array() *
                             psidd.array() * nodevals.segment(3, Ns0).array())
                                .sum();
      if (rel_orient_[0] == lf::mesh::Orientation::positive) {
        dofs[1 + i - 3] =
            (P1 * nodevals[1] - P0 * nodevals[0] - integ1) * (2 * i - 1);
      } else {
        dofs[4 - i + (edge_degrees_[0] - 1) - 3] =
            (P1 * nodevals[0] - P0 * nodevals[1] - integ1) * (2 * i - 1);
      }
    }

    // Compute the basis function coefficients for the second edge
    for (base::size_type i = 2; i < edge_degrees_[1] + 1; ++i) {
      const SCALAR P0 = ILegendreDx(i, 0);
      const SCALAR P1 = ILegendreDx(i, 1);
      Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> psidd =
          qr_dual_edge_[1]->Points().unaryExpr(
              [&](double x) -> SCALAR { return LegendreDx(i - 1, x); });

      const SCALAR integ2 =
          (qr_dual_edge_[1]->Weights().transpose().array() * psidd.array() *
           nodevals.segment(3 + Ns0, Ns1).array())
              .sum();
      if (rel_orient_[1] == lf::mesh::Orientation::positive) {
        dofs[1 + i + (edge_degrees_[0] - 1) - 3] =
            (P1 * nodevals[2] - P0 * nodevals[1] - integ2) * (2 * i - 1);
      } else {
        dofs[4 - i + (edge_degrees_[0] + edge_degrees_[1] - 2) - 3] =
            (P1 * nodevals[1] - P0 * nodevals[2] - integ2) * (2 * i - 1);
      }
    }

    // Compute the basis function coefficients for the second edge
    for (base::size_type i = 2; i < edge_degrees_[2] + 1; ++i) {
      const SCALAR P0 = ILegendreDx(i, 0);
      const SCALAR P1 = ILegendreDx(i, 1);
      Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> psidd =
          qr_dual_edge_[2]->Points().unaryExpr(
              [&](double x) -> SCALAR { return LegendreDx(i - 1, x); });

      const SCALAR integ3 =
          (qr_dual_edge_[2]->Weights().transpose().array() * psidd.array() *
           nodevals.segment(3 + Ns0 + Ns1, Ns2).array())
              .sum();
      if (rel_orient_[2] == lf::mesh::Orientation::positive) {
        dofs[1 + i + (edge_degrees_[0] + edge_degrees_[1] - 2) - 3] =
            (P1 * nodevals[0] - P0 * nodevals[2] - integ3) * (2 * i - 1);
      } else {
        dofs[4 - i +
             (edge_degrees_[0] + edge_degrees_[1] + edge_degrees_[2] - 3) - 3] =
            (P1 * nodevals[2] - P0 * nodevals[0] - integ3) * (2 * i - 1);
      }
    }

    return dofs;
  }